

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int stbtt_PackFontRange(stbtt_pack_context *spc,uchar *fontdata,int font_index,float font_size,
                       int first_unicode_codepoint_in_range,int num_chars_in_range,
                       stbtt_packedchar *chardata_for_range)

{
  int iVar1;
  stbtt_pack_range range;
  int in_stack_0000006c;
  stbtt_pack_range *in_stack_00000070;
  int in_stack_0000007c;
  uchar *in_stack_00000080;
  stbtt_pack_context *in_stack_00000088;
  
  iVar1 = stbtt_PackFontRanges
                    (in_stack_00000088,in_stack_00000080,in_stack_0000007c,in_stack_00000070,
                     in_stack_0000006c);
  return iVar1;
}

Assistant:

STBTT_DEF int stbtt_PackFontRange(stbtt_pack_context *spc, const unsigned char *fontdata, int font_index, float font_size,
int first_unicode_codepoint_in_range, int num_chars_in_range, stbtt_packedchar *chardata_for_range)
{
stbtt_pack_range range;
range.first_unicode_codepoint_in_range = first_unicode_codepoint_in_range;
range.array_of_unicode_codepoints = NULL;
range.num_chars                   = num_chars_in_range;
range.chardata_for_range          = chardata_for_range;
range.font_size                   = font_size;
return stbtt_PackFontRanges(spc, fontdata, font_index, &range, 1);
}